

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinifyImportsAndExports.cpp
# Opt level: O0

void __thiscall
wasm::MinifyImportsAndExports::MinifyImportsAndExports
          (MinifyImportsAndExports *this,bool minifyExports,bool minifyModules)

{
  bool minifyModules_local;
  bool minifyExports_local;
  MinifyImportsAndExports *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__MinifyImportsAndExports_0309db98;
  this->minifyExports = minifyExports;
  this->minifyModules = minifyModules;
  wasm::Name::Name(&this->SINGLETON_MODULE_NAME,"a");
  return;
}

Assistant:

explicit MinifyImportsAndExports(bool minifyExports, bool minifyModules)
    : minifyExports(minifyExports), minifyModules(minifyModules) {}